

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_window_is_any_hovered(nk_context *ctx)

{
  float fVar1;
  nk_rect rect;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  nk_rect header;
  nk_window *local_20;
  nk_window *iter;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x40b8,"int nk_window_is_any_hovered(struct nk_context *)");
  }
  if (ctx != (nk_context *)0x0) {
    for (local_20 = ctx->begin; local_20 != (nk_window *)0x0; local_20 = local_20->next) {
      if ((local_20->flags & 0x2000) == 0) {
        if ((((local_20->popup).active != 0) && ((local_20->popup).win != (nk_window *)0x0)) &&
           (iVar5 = nk_input_is_mouse_hovering_rect(&ctx->input,((local_20->popup).win)->bounds),
           iVar5 != 0)) {
          return 1;
        }
        if ((local_20->flags & 0x8000) == 0) {
          iVar5 = nk_input_is_mouse_hovering_rect(&ctx->input,local_20->bounds);
          if (iVar5 != 0) {
            return 1;
          }
        }
        else {
          uVar2 = (local_20->bounds).x;
          uVar3 = (local_20->bounds).y;
          uVar4 = (local_20->bounds).w;
          rect.w = (float)uVar4;
          rect.y = (float)uVar3;
          rect.x = (float)uVar2;
          fVar1 = (ctx->style).window.header.padding.y;
          rect.h = fVar1 + fVar1 + ((ctx->style).font)->height;
          iVar5 = nk_input_is_mouse_hovering_rect(&ctx->input,rect);
          if (iVar5 != 0) {
            return 1;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

NK_API int
nk_window_is_any_hovered(struct nk_context *ctx)
{
    struct nk_window *iter;
    NK_ASSERT(ctx);
    if (!ctx) return 0;
    iter = ctx->begin;
    while (iter) {
        /* check if window is being hovered */
        if(!(iter->flags & NK_WINDOW_HIDDEN)) {
            /* check if window popup is being hovered */
            if (iter->popup.active && iter->popup.win && nk_input_is_mouse_hovering_rect(&ctx->input, iter->popup.win->bounds))
                return 1;

            if (iter->flags & NK_WINDOW_MINIMIZED) {
                struct nk_rect header = iter->bounds;
                header.h = ctx->style.font->height + 2 * ctx->style.window.header.padding.y;
                if (nk_input_is_mouse_hovering_rect(&ctx->input, header))
                    return 1;
            } else if (nk_input_is_mouse_hovering_rect(&ctx->input, iter->bounds)) {
                return 1;
            }
        }
        iter = iter->next;
    }
    return 0;
}